

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

void __thiscall lest::confirm::~confirm(confirm *this)

{
  bool bVar1;
  ostream *poVar2;
  allocator local_1b9;
  string local_1b8 [32];
  string local_198 [32];
  text local_178 [39];
  allocator local_151;
  string local_150 [32];
  string local_130 [32];
  lest local_110 [39];
  allocator local_e9;
  string local_e8 [32];
  string local_c8 [32];
  text local_a8 [39];
  allocator local_81;
  string local_80 [32];
  string local_60 [32];
  lest local_40 [48];
  confirm *local_10;
  confirm *this_local;
  
  local_10 = this;
  if (this->failures < 1) {
    bVar1 = env::pass(&this->output);
    if (bVar1) {
      poVar2 = std::operator<<((this->super_action).os,"All ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->selected);
      poVar2 = std::operator<<(poVar2," selected ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_150,"test",&local_151);
      std::__cxx11::string::string(local_130,local_150);
      pluralise(local_110,(text *)local_130,this->selected);
      poVar2 = std::operator<<(poVar2,(string *)local_110);
      poVar2 = std::operator<<(poVar2," ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b8,"passed.\n",&local_1b9);
      std::__cxx11::string::string(local_198,local_1b8);
      colourise(local_178);
      std::operator<<(poVar2,(string *)local_178);
      std::__cxx11::string::~string((string *)local_178);
      std::__cxx11::string::~string(local_198);
      std::__cxx11::string::~string(local_1b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
      std::__cxx11::string::~string((string *)local_110);
      std::__cxx11::string::~string(local_130);
      std::__cxx11::string::~string(local_150);
      std::allocator<char>::~allocator((allocator<char> *)&local_151);
    }
  }
  else {
    poVar2 = (ostream *)std::ostream::operator<<((this->super_action).os,this->failures);
    poVar2 = std::operator<<(poVar2," out of ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->selected);
    poVar2 = std::operator<<(poVar2," selected ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"test",&local_81);
    std::__cxx11::string::string(local_60,local_80);
    pluralise(local_40,(text *)local_60,this->selected);
    poVar2 = std::operator<<(poVar2,(string *)local_40);
    poVar2 = std::operator<<(poVar2," ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"failed.\n",&local_e9);
    std::__cxx11::string::string(local_c8,local_e8);
    colourise(local_a8);
    std::operator<<(poVar2,(string *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    std::__cxx11::string::~string((string *)local_40);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  env::~env(&this->output);
  return;
}

Assistant:

~confirm()
    {
        if ( failures > 0 )
        {
            os << failures << " out of " << selected << " selected " << pluralise("test", selected) << " " << colourise( "failed.\n" );
        }
        else if ( output.pass() )
        {
            os << "All " << selected << " selected " << pluralise("test", selected) << " " << colourise( "passed.\n" );
        }
    }